

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamMultiReaderPrivate::UpdateAlignmentCache(BamMultiReaderPrivate *this)

{
  bool bVar1;
  IMultiMerger *pIVar2;
  iterator reader_00;
  iterator alignment_00;
  reference pMVar3;
  long in_RDI;
  BamAlignment *alignment;
  BamReader *reader;
  MergeItem *item;
  iterator readerEnd;
  iterator readerIter;
  BamMultiReaderPrivate *in_stack_000000e8;
  vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
  *in_stack_ffffffffffffff50;
  allocator *paVar4;
  BamMultiReaderPrivate *in_stack_ffffffffffffff90;
  string local_68 [24];
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  BamMultiReaderPrivate *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [48];
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    pIVar2 = CreateAlignmentCache(in_stack_000000e8);
    *(IMultiMerger **)(in_RDI + 0x18) = pIVar2;
    if (*(long *)(in_RDI + 0x18) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,"BamMultiReader::UpdateAlignmentCache",&local_31);
      paVar4 = (allocator *)&stack0xffffffffffffff97;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"unable to create new alignment cache",paVar4);
      SetErrorString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      return false;
    }
  }
  (**(code **)(**(long **)(in_RDI + 0x18) + 0x18))();
  reader_00 = std::
              vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
              ::begin(in_stack_ffffffffffffff48);
  alignment_00 = std::
                 vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
                 ::end(in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff50,
                            (__normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    pMVar3 = __gnu_cxx::
             __normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
             ::operator*((__normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
                          *)&stack0xffffffffffffff88);
    if ((pMVar3->Reader != (BamReader *)0x0) && (pMVar3->Alignment != (BamAlignment *)0x0)) {
      SaveNextAlignment(in_stack_ffffffffffffff90,(BamReader *)reader_00._M_current,
                        (BamAlignment *)alignment_00._M_current);
    }
    __gnu_cxx::
    __normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
    ::operator++((__normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
                  *)&stack0xffffffffffffff88);
  }
  return true;
}

Assistant:

bool BamMultiReaderPrivate::UpdateAlignmentCache()
{

    // create alignment cache if not created yet
    if (m_alignmentCache == 0) {
        m_alignmentCache = CreateAlignmentCache();
        if (m_alignmentCache == 0) {
            SetErrorString("BamMultiReader::UpdateAlignmentCache",
                           "unable to create new alignment cache");
            return false;
        }
    }

    // clear any prior cache data
    m_alignmentCache->Clear();

    // iterate over readers
    std::vector<MergeItem>::iterator readerIter = m_readers.begin();
    std::vector<MergeItem>::iterator readerEnd = m_readers.end();
    for (; readerIter != readerEnd; ++readerIter) {
        MergeItem& item = (*readerIter);
        BamReader* reader = item.Reader;
        BamAlignment* alignment = item.Alignment;
        if (reader == 0 || alignment == 0) continue;

        // save next alignment from each reader in cache
        SaveNextAlignment(reader, alignment);
    }

    // if we get here, ok
    return true;
}